

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_equivalence_test.h
# Opt level: O0

ostream * libaom_test::operator<<
                    (ostream *os,
                    FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>
                    *p)

{
  ostream *poVar1;
  undefined8 *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"bit_depth:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 2));
  poVar1 = std::operator<<(poVar1," function:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(void *)*in_RSI);
  poVar1 = std::operator<<(poVar1," function:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(void *)in_RSI[1]);
  return poVar1;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const FuncParam<T> &p) {
  return os << "bit_depth:" << p.bit_depth
            << " function:" << reinterpret_cast<const void *>(p.ref_func)
            << " function:" << reinterpret_cast<const void *>(p.tst_func);
}